

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::RepeatedMessageFieldGenerator::
GenerateSerializeWithCachedSizesToArray(RepeatedMessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "for (int i = 0; i < this->$name$_size(); i++) {\n  target = ::google::protobuf::internal::WireFormatLite::\n    Write$declared_type$NoVirtualToArray(\n      $number$, this->$name$(i), target);\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  printer->Print(variables_,
    "for (int i = 0; i < this->$name$_size(); i++) {\n"
    "  target = ::google::protobuf::internal::WireFormatLite::\n"
    "    Write$declared_type$NoVirtualToArray(\n"
    "      $number$, this->$name$(i), target);\n"
    "}\n");
}